

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLExportVisitor::visit_(IDLExportVisitor *this,Compound *type)

{
  ostream *poVar1;
  undefined1 local_90 [8];
  Indent indenter;
  string local_58;
  string local_38;
  Compound *local_18;
  Compound *type_local;
  IDLExportVisitor *this_local;
  
  local_18 = type;
  type_local = (Compound *)this;
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,"struct ");
  Typelib::Type::getBasename_abi_cxx11_();
  normalizeIDLName(&local_38,&local_58);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1," {\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  Indent::Indent((Indent *)local_90,&this->m_indent);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent((Indent *)local_90);
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"};\n");
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type)
    {
        m_stream << m_indent << "struct " << normalizeIDLName(type.getBasename()) << " {\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent
            << "};\n";

        return true;
    }